

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::TransformFeedbackOverflowQueryFunctionalBase
          (TransformFeedbackOverflowQueryFunctionalBase *this,Context *context,API api,char *name,
          char *description)

{
  char *description_local;
  char *name_local;
  API api_local;
  Context *context_local;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  TransformFeedbackOverflowQueryBaseTest::TransformFeedbackOverflowQueryBaseTest
            (&this->super_TransformFeedbackOverflowQueryBaseTest,context,api,name,description);
  (this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__TransformFeedbackOverflowQueryFunctionalBase_0321dc20;
  this->m_overflow_query = 0;
  this->m_stream_overflow_query = (GLuint *)0x0;
  this->m_query_buffer = 0;
  this->m_tf_buffer_count = 0;
  this->m_tf_buffer = (GLuint *)0x0;
  this->m_vao = 0;
  this->m_program = 0;
  this->m_checker_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

TransformFeedbackOverflowQueryFunctionalBase(deqp::Context& context, TransformFeedbackOverflowQueryTests::API api,
												 const char* name, const char* description)
		: TransformFeedbackOverflowQueryBaseTest(context, api, name, description)
		, m_overflow_query(0)
		, m_stream_overflow_query(NULL)
		, m_query_buffer(0)
		, m_tf_buffer_count(0)
		, m_tf_buffer(NULL)
		, m_vao(0)
		, m_program(0)
		, m_checker_program(NULL)
	{
	}